

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_7d1152::AVxEncoderThreadTest::DoTestMaxThreads
          (AVxEncoderThreadTest *this,YUVVideoSource *video,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *ref_size_enc,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ref_md5_enc,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ref_md5_dec)

{
  pointer puVar1;
  undefined8 *puVar2;
  bool bVar3;
  SEARCH_METHODS *pSVar4;
  AssertionResult gtest_ar;
  vector<unsigned_long,_std::allocator<unsigned_long>_> multi_thr_max_row_mt_size_enc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  multi_thr_max_row_mt_md5_enc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  multi_thr_max_row_mt_md5_dec;
  Message local_a8;
  AssertHelper local_a0;
  internal local_98 [8];
  undefined8 *local_90;
  undefined1 local_88 [16];
  TestPartResultReporterInterface *local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (this->super_EncoderTest).cfg_.g_threads = 0x40;
  bVar3 = testing::internal::AlwaysTrue();
  if (!bVar3) {
LAB_004dc1f8:
    testing::Message::Message((Message *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/ethread_test.cc"
               ,0x1a9,
               "Expected: RunLoop(video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if ((_func_int **)local_88._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_88._0_8_ + 8))();
    }
    return;
  }
  testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
            ((HasNewFatalFailureHelper *)local_88);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    (*(this->super_EncoderTest)._vptr_EncoderTest[2])(&this->super_EncoderTest,video);
  }
  testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
            ((HasNewFatalFailureHelper *)local_88);
  if (local_88[8] == true) goto LAB_004dc1f8;
  local_88._0_8_ = (_func_int **)0x0;
  local_88._8_8_ = (pointer)0x0;
  local_78 = (TestPartResultReporterInterface *)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88,&this->size_enc_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&local_68,&this->md5_enc_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&local_48,&this->md5_dec_);
  puVar1 = (this->size_enc_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->size_enc_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->size_enc_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->md5_enc_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->md5_dec_);
  testing::internal::
  CmpHelperEQ<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
            (local_98,"ref_size_enc","multi_thr_max_row_mt_size_enc",ref_size_enc,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88);
  puVar2 = local_90;
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message(&local_a8);
    if (local_90 == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = (SEARCH_METHODS *)*local_90;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/ethread_test.cc"
               ,0x1b5,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_a0,&local_a8);
  }
  else {
    if (local_90 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_90 != local_90 + 2) {
        operator_delete((undefined8 *)*local_90);
      }
      operator_delete(puVar2);
    }
    testing::internal::
    CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (local_98,"ref_md5_enc","multi_thr_max_row_mt_md5_enc",ref_md5_enc,&local_68);
    puVar2 = local_90;
    if (local_98[0] == (internal)0x0) {
      testing::Message::Message(&local_a8);
      if (local_90 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_90;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/ethread_test.cc"
                 ,0x1b6,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_a0,&local_a8);
    }
    else {
      if (local_90 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_90 != local_90 + 2) {
          operator_delete((undefined8 *)*local_90);
        }
        operator_delete(puVar2);
      }
      testing::internal::
      CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (local_98,"ref_md5_dec","multi_thr_max_row_mt_md5_dec",ref_md5_dec,&local_48);
      if (local_98[0] != (internal)0x0) goto LAB_004dc499;
      testing::Message::Message(&local_a8);
      if (local_90 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_90;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/ethread_test.cc"
                 ,0x1b7,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_a0,&local_a8);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_a0);
  if (local_a8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_a8.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
LAB_004dc499:
  if (local_90 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_90 != local_90 + 2) {
      operator_delete((undefined8 *)*local_90);
    }
    operator_delete(local_90);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  if ((_func_int **)local_88._0_8_ == (_func_int **)0x0) {
    return;
  }
  operator_delete((void *)local_88._0_8_);
  return;
}

Assistant:

virtual void DoTestMaxThreads(::libaom_test::YUVVideoSource *video,
                                const std::vector<size_t> ref_size_enc,
                                const std::vector<std::string> ref_md5_enc,
                                const std::vector<std::string> ref_md5_dec) {
    cfg_.g_threads = MAX_NUM_THREADS;
    ASSERT_NO_FATAL_FAILURE(RunLoop(video));
    std::vector<size_t> multi_thr_max_row_mt_size_enc;
    std::vector<std::string> multi_thr_max_row_mt_md5_enc;
    std::vector<std::string> multi_thr_max_row_mt_md5_dec;
    multi_thr_max_row_mt_size_enc = size_enc_;
    multi_thr_max_row_mt_md5_enc = md5_enc_;
    multi_thr_max_row_mt_md5_dec = md5_dec_;
    size_enc_.clear();
    md5_enc_.clear();
    md5_dec_.clear();

    // Check that the vectors are equal.
    ASSERT_EQ(ref_size_enc, multi_thr_max_row_mt_size_enc);
    ASSERT_EQ(ref_md5_enc, multi_thr_max_row_mt_md5_enc);
    ASSERT_EQ(ref_md5_dec, multi_thr_max_row_mt_md5_dec);
  }